

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall QRenderRule::fixupBorder(QRenderRule *this,int nativeWidth)

{
  bool bVar1;
  BrushStyle BVar2;
  ulong uVar3;
  QStyleSheetPaletteData *pQVar4;
  QStyleSheetBorderData *pQVar5;
  QStyleSheetBorderImageData *pQVar6;
  int in_ESI;
  QSize *in_RDI;
  long in_FS_OFFSET;
  int i_1;
  QStyleSheetBorderImageData *bi;
  int i;
  bool hasRadius;
  QBrush color;
  QStyleSheetBorderImageData *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  bool local_51;
  int local_44;
  int local_34;
  QBrush local_20 [8];
  undefined1 *local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0;
  bVar1 = ::operator==((QSharedDataPointer<QStyleSheetBorderData> *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (nullptr_t *)in_stack_ffffffffffffff98);
  if (!bVar1) {
    QSharedDataPointer<QStyleSheetBorderData>::operator->
              ((QSharedDataPointer<QStyleSheetBorderData> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    bVar1 = QStyleSheetBorderData::hasBorderImage
                      ((QStyleSheetBorderData *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if (bVar1) {
      QSharedDataPointer<QStyleSheetBorderData>::operator->
                ((QSharedDataPointer<QStyleSheetBorderData> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      QSharedDataPointer<QStyleSheetBorderImageData>::operator->
                ((QSharedDataPointer<QStyleSheetBorderImageData> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      uVar3 = QPixmap::isNull();
      if ((uVar3 & 1) == 0) {
        QSharedDataPointer<QStyleSheetBorderData>::operator->
                  ((QSharedDataPointer<QStyleSheetBorderData> *)
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        pQVar6 = ::QSharedDataPointer::operator_cast_to_QStyleSheetBorderImageData_
                           ((QSharedDataPointer<QStyleSheetBorderImageData> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        if (pQVar6->cuts[0] == -1) {
          for (local_44 = 0; local_44 < 4; local_44 = local_44 + 1) {
            pQVar5 = border((QRenderRule *)0x42359e);
            pQVar6->cuts[local_44] = pQVar5->borders[local_44];
          }
        }
        goto LAB_004235c4;
      }
    }
    QSharedDataPointer<QStyleSheetBorderData>::operator->
              ((QSharedDataPointer<QStyleSheetBorderData> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    QSharedDataPointer<QStyleSheetBorderImageData>::operator=
              ((QSharedDataPointer<QStyleSheetBorderImageData> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98);
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = ::QSharedDataPointer::operator_cast_to_QStyleSheetPaletteData_
                       ((QSharedDataPointer<QStyleSheetPaletteData> *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if (pQVar4 == (QStyleSheetPaletteData *)0x0) {
      QBrush::QBrush((QBrush *)&local_18);
    }
    else {
      pQVar4 = QSharedDataPointer<QStyleSheetPaletteData>::operator->
                         ((QSharedDataPointer<QStyleSheetPaletteData> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      QBrush::QBrush((QBrush *)&local_18,&pQVar4->foreground);
    }
    QSharedDataPointer<QStyleSheetBorderData>::operator->
              ((QSharedDataPointer<QStyleSheetBorderData> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    bVar1 = QSize::isValid(in_RDI);
    local_51 = true;
    if (!bVar1) {
      QSharedDataPointer<QStyleSheetBorderData>::operator->
                ((QSharedDataPointer<QStyleSheetBorderData> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      bVar1 = QSize::isValid(in_RDI);
      local_51 = true;
      if (!bVar1) {
        QSharedDataPointer<QStyleSheetBorderData>::operator->
                  ((QSharedDataPointer<QStyleSheetBorderData> *)
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        bVar1 = QSize::isValid(in_RDI);
        local_51 = true;
        if (!bVar1) {
          QSharedDataPointer<QStyleSheetBorderData>::operator->
                    ((QSharedDataPointer<QStyleSheetBorderData> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
          local_51 = QSize::isValid(in_RDI);
        }
      }
    }
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->
                         ((QSharedDataPointer<QStyleSheetBorderData> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      if ((pQVar5->styles[local_34] == BorderStyle_Native) && (local_51 != false)) {
        pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->
                           ((QSharedDataPointer<QStyleSheetBorderData> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        pQVar5->styles[local_34] = BorderStyle_None;
      }
      pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->
                         ((QSharedDataPointer<QStyleSheetBorderData> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      if (pQVar5->styles[local_34] == BorderStyle_None) {
        QBrush::QBrush(local_20);
        QSharedDataPointer<QStyleSheetBorderData>::operator->
                  ((QSharedDataPointer<QStyleSheetBorderData> *)
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        QBrush::operator=((QBrush *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          (QBrush *)in_stack_ffffffffffffff98);
        QBrush::~QBrush(local_20);
        pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->
                           ((QSharedDataPointer<QStyleSheetBorderData> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        pQVar5->borders[local_34] = 0;
      }
      else {
        if ((pQVar5->styles[local_34] == BorderStyle_Native) &&
           (pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->
                               ((QSharedDataPointer<QStyleSheetBorderData> *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)),
           pQVar5->borders[local_34] == 0)) {
          in_stack_ffffffffffffffa4 = in_ESI;
          pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->
                             ((QSharedDataPointer<QStyleSheetBorderData> *)
                              CONCAT44(in_ESI,in_stack_ffffffffffffffa0));
          pQVar5->borders[local_34] = in_stack_ffffffffffffffa4;
        }
        QSharedDataPointer<QStyleSheetBorderData>::operator->
                  ((QSharedDataPointer<QStyleSheetBorderData> *)
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        BVar2 = QBrush::style((QBrush *)0x42350b);
        if (BVar2 == NoBrush) {
          pQVar5 = QSharedDataPointer<QStyleSheetBorderData>::operator->
                             ((QSharedDataPointer<QStyleSheetBorderData> *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
          QBrush::operator=((QBrush *)(pQVar5->borders + (long)local_34 * 2 + 5),(QBrush *)&local_18
                           );
        }
      }
    }
    QBrush::~QBrush((QBrush *)&local_18);
  }
LAB_004235c4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRenderRule::fixupBorder(int nativeWidth)
{
    if (bd == nullptr)
        return;

    if (!bd->hasBorderImage() || bd->bi->pixmap.isNull()) {
        bd->bi = nullptr;
        // ignore the color, border of edges that have none border-style
        QBrush color = pal ? pal->foreground : QBrush();
        const bool hasRadius = bd->radii[0].isValid() || bd->radii[1].isValid()
                               || bd->radii[2].isValid() || bd->radii[3].isValid();
        for (int i = 0; i < 4; i++) {
            if ((bd->styles[i] == BorderStyle_Native) && hasRadius)
                bd->styles[i] = BorderStyle_None;

            switch (bd->styles[i]) {
            case BorderStyle_None:
                // border-style: none forces width to be 0
                bd->colors[i] = QBrush();
                bd->borders[i] = 0;
                break;
            case BorderStyle_Native:
                if (bd->borders[i] == 0)
                    bd->borders[i] = nativeWidth;
                Q_FALLTHROUGH();
            default:
                if (bd->colors[i].style() == Qt::NoBrush) // auto-acquire 'color'
                    bd->colors[i] = color;
                break;
            }
        }

        return;
    }

    // inspect the border image
    QStyleSheetBorderImageData *bi = bd->bi;
    if (bi->cuts[0] == -1) {
        for (int i = 0; i < 4; i++) // assume, cut = border
            bi->cuts[i] = int(border()->borders[i]);
    }
}